

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_ruleparser.h
# Opt level: O2

void __thiscall BamTools::RuleParser::~RuleParser(RuleParser *this)

{
  std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>::~deque
            (&(this->m_operatorStack).c);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&(this->m_ruleQueue).c);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~RuleParser() {}